

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O3

Gia_Man_t *
Gia_ManBmcUnroll(Gia_Man_t *pGia,int nFramesMax,int nFramesAdd,int fVerbose,Vec_Int_t **pvPiMap)

{
  void **__ptr;
  void *pvVar1;
  undefined8 uVar2;
  char *__s;
  int iVar3;
  Vec_Int_t *vNodes;
  int *piVar4;
  Vec_Int_t *vLeaves;
  Vec_Ptr_t *__ptr_00;
  Vec_Int_t *pVVar5;
  void *__s_00;
  ulong uVar6;
  Vec_Int_t *pVVar7;
  Gia_Man_t *p;
  size_t sVar8;
  char *__dest;
  Vec_Int_t *pVVar9;
  Gia_Man_t *pGVar10;
  int iVar11;
  ulong uVar12;
  int i;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  uint *pState;
  int iFirst;
  uint *local_90;
  int local_34;
  
  Gia_ManCleanPhase(pGia);
  vNodes = (Vec_Int_t *)malloc(0x10);
  vNodes->nCap = 1000;
  vNodes->nSize = 0;
  piVar4 = (int *)malloc(4000);
  vNodes->pArray = piVar4;
  vLeaves = (Vec_Int_t *)malloc(0x10);
  vLeaves->nCap = 1000;
  vLeaves->nSize = 0;
  piVar4 = (int *)malloc(4000);
  vLeaves->pArray = piVar4;
  __ptr_00 = Bmc_MnaTernary(pGia,nFramesMax,nFramesAdd,fVerbose,&local_34);
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  piVar4 = (int *)malloc(4000);
  pVVar5->pArray = piVar4;
  *pvPiMap = pVVar5;
  uVar16 = __ptr_00->nSize;
  uVar13 = 8;
  if (6 < uVar16 - 1) {
    uVar13 = uVar16;
  }
  if (uVar13 == 0) {
    __s_00 = (void *)0x0;
  }
  else {
    __s_00 = malloc((long)(int)uVar13 << 3);
  }
  memset(__s_00,0,(long)(int)uVar16 * 8);
  uVar6 = (ulong)uVar16;
  uVar13 = 0;
  uVar14 = uVar6;
  do {
    if ((int)uVar14 < 1) {
      __assert_fail("f >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcAnd.c"
                    ,0x143,"Gia_Man_t *Gia_ManBmcUnroll(Gia_Man_t *, int, int, int, Vec_Int_t **)");
    }
    uVar12 = uVar14 - 1;
    __ptr = __ptr_00->pArray;
    if ((int)uVar12 == 0) {
      local_90 = (uint *)0x0;
    }
    else {
      local_90 = (uint *)__ptr[uVar14 - 2];
    }
    pvVar1 = __ptr[uVar12 & 0xffffffff];
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    pVVar7->nCap = 100;
    pVVar7->nSize = 0;
    piVar4 = (int *)malloc(400);
    pVVar7->pArray = piVar4;
    iVar3 = pGia->nRegs;
    pVVar5 = pGia->vCos;
    iVar11 = pVVar5->nSize;
    if (iVar3 < iVar11) {
      lVar17 = 0;
      do {
        if (iVar11 <= lVar17) goto LAB_0056dd3b;
        iVar11 = pVVar5->pArray[lVar17];
        if (((long)iVar11 < 0) || (pGia->nObjs <= iVar11)) goto LAB_0056dd1c;
        if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
        uVar2 = *(undefined8 *)(pGia->pObjs + iVar11);
        if (-1 < (int)uVar2) {
          __assert_fail("pObj->fTerm",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
        }
        if ((~(*(uint *)((long)pvVar1 + (ulong)(((uint)((ulong)uVar2 >> 0x20) & 0x1ffffff0) >> 2))
              >> ((char)((ulong)uVar2 >> 0x20) * '\x02' & 0x1fU)) & 3) == 0) {
          Vec_IntPush(pVVar7,iVar11);
          iVar3 = pGia->nRegs;
          pVVar5 = pGia->vCos;
        }
        lVar17 = lVar17 + 1;
        iVar11 = pVVar5->nSize;
      } while (lVar17 < iVar11 - iVar3);
    }
    if (0 < (int)uVar13) {
      piVar4 = vLeaves->pArray;
      uVar14 = 0;
      do {
        Vec_IntPush(pVVar7,piVar4[uVar14]);
        uVar14 = uVar14 + 1;
      } while (uVar13 != uVar14);
    }
    *(Vec_Int_t **)((long)__s_00 + (uVar12 & 0xffffffff) * 8) = pVVar7;
    Bmc_MnaCollect(pGia,pVVar7,vNodes,local_90);
    Bmc_MnaSelect(pGia,pVVar7,vNodes,vLeaves);
    if (fVerbose == 0) {
      uVar13 = vLeaves->nSize;
    }
    else {
      uVar13 = vLeaves->nSize;
      printf("Frame %4d :  Roots = %6d  Leaves = %6d  Cone = %6d\n",uVar12 & 0xffffffff,
             (ulong)(uint)pVVar7->nSize,(ulong)uVar13,(ulong)(uint)vNodes->nSize);
    }
    uVar14 = uVar12;
  } while (uVar13 != 0);
  iVar3 = pGia->nObjs;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar11 = iVar3;
  }
  pVVar5->nCap = iVar11;
  if (iVar11 == 0) {
    pVVar5->pArray = (int *)0x0;
    pVVar5->nSize = iVar3;
  }
  else {
    piVar4 = (int *)malloc((long)iVar11 << 2);
    pVVar5->pArray = piVar4;
    pVVar5->nSize = iVar3;
    if (piVar4 != (int *)0x0) {
      memset(piVar4,0xff,(long)iVar3 << 2);
    }
  }
  p = Gia_ManStart(10000);
  __s = pGia->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar8 = strlen(__s);
    __dest = (char *)malloc(sVar8 + 1);
    strcpy(__dest,__s);
  }
  p->pName = __dest;
  Gia_ManHashStart(p);
  if (0 < (int)uVar16) {
    uVar14 = 0;
    do {
      pVVar7 = *(Vec_Int_t **)((long)__s_00 + uVar14 * 8);
      if (pVVar7 == (Vec_Int_t *)0x0) {
        pVVar7 = pGia->vCos;
        uVar12 = (ulong)(uint)pVVar7->nSize;
        if (pGia->nRegs < pVVar7->nSize) {
          lVar17 = 0;
          do {
            if ((int)uVar12 <= lVar17) goto LAB_0056dd3b;
            if ((pVVar7->pArray[lVar17] < 0) || (pGia->nObjs <= pVVar7->pArray[lVar17]))
            goto LAB_0056dd1c;
            if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
            Gia_ManAppendCo(p,0);
            lVar17 = lVar17 + 1;
            pVVar7 = pGia->vCos;
            uVar12 = (ulong)pVVar7->nSize;
          } while (lVar17 < (long)(uVar12 - (long)pGia->nRegs));
        }
      }
      else {
        if (uVar14 == 0) {
          pState = (uint *)0x0;
        }
        else {
          pState = (uint *)__ptr[uVar14 - 1];
        }
        pVVar9 = pGia->vCos;
        uVar12 = (ulong)(uint)pVVar9->nSize;
        if (pGia->nRegs < pVVar9->nSize) {
          lVar17 = 0;
          do {
            if ((int)uVar12 <= lVar17) goto LAB_0056dd3b;
            iVar3 = pVVar9->pArray[lVar17];
            if (((long)iVar3 < 0) || (pGia->nObjs <= iVar3)) goto LAB_0056dd1c;
            if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
            if (pVVar5->nSize <= iVar3) goto LAB_0056dd79;
            pVVar5->pArray[iVar3] = 0;
            lVar17 = lVar17 + 1;
            uVar12 = (ulong)pVVar9->nSize;
          } while (lVar17 < (long)(uVar12 - (long)pGia->nRegs));
        }
        Vec_IntPush(*pvPiMap,~(uint)uVar14);
        Bmc_MnaCollect(pGia,pVVar7,vNodes,pState);
        Bmc_MnaBuild(pGia,pVVar7,vNodes,p,pVVar5,*pvPiMap);
        if (fVerbose != 0) {
          printf("Frame %4d :  Roots = %6d  Leaves = %6d  Cone = %6d\n",uVar14 & 0xffffffff,
                 (ulong)(uint)pVVar7->nSize,0,(ulong)(uint)vNodes->nSize);
        }
        pVVar9 = pGia->vCos;
        uVar12 = (ulong)(uint)pVVar9->nSize;
        if (pGia->nRegs < pVVar9->nSize) {
          lVar17 = 0;
          do {
            if ((int)uVar12 <= lVar17) goto LAB_0056dd3b;
            iVar3 = pVVar9->pArray[lVar17];
            if (((long)iVar3 < 0) || (pGia->nObjs <= iVar3)) goto LAB_0056dd1c;
            if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
            if (pVVar5->nSize <= iVar3) goto LAB_0056dd3b;
            Gia_ManAppendCo(p,pVVar5->pArray[iVar3]);
            lVar17 = lVar17 + 1;
            pVVar9 = pGia->vCos;
            uVar12 = (ulong)pVVar9->nSize;
          } while (lVar17 < (long)(uVar12 - (long)pGia->nRegs));
        }
        iVar3 = pVVar7->nSize;
        if (0 < iVar3) {
          piVar4 = pVVar7->pArray;
          lVar17 = 0;
LAB_0056db3f:
          iVar11 = piVar4[lVar17];
          lVar15 = (long)iVar11;
          if ((lVar15 < 0) || (pGia->nObjs <= iVar11)) goto LAB_0056dd1c;
          if (pGia->pObjs != (Gia_Obj_t *)0x0) goto code_r0x0056db66;
        }
      }
LAB_0056dc17:
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar6);
  }
  Gia_ManHashStop(p);
  lVar17 = uVar6 + (uVar6 == 0);
  lVar15 = 0;
  do {
    pvVar1 = *(void **)((long)__s_00 + lVar15 * 8);
    if (pvVar1 != (void *)0x0) {
      if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
        free(*(void **)((long)pvVar1 + 8));
      }
      free(pvVar1);
    }
    lVar15 = lVar15 + 1;
  } while (lVar17 != lVar15);
  free(__s_00);
  if (__ptr_00 != (Vec_Ptr_t *)0x0) {
    lVar15 = 0;
    do {
      if ((void *)0x2 < __ptr[lVar15]) {
        free(__ptr[lVar15]);
      }
      lVar15 = lVar15 + 1;
    } while (lVar17 != lVar15);
    free(__ptr);
    free(__ptr_00);
  }
  if (vLeaves->pArray != (int *)0x0) {
    free(vLeaves->pArray);
  }
  free(vLeaves);
  if (vNodes->pArray != (int *)0x0) {
    free(vNodes->pArray);
  }
  free(vNodes);
  if (pVVar5->pArray != (int *)0x0) {
    free(pVVar5->pArray);
  }
  free(pVVar5);
  pGVar10 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  return pGVar10;
code_r0x0056db66:
  uVar2 = *(undefined8 *)(pGia->pObjs + lVar15);
  uVar16 = (uint)uVar2;
  if ((~uVar16 & 0x1fffffff) != 0 && (int)uVar16 < 0) {
    uVar16 = (uint)((ulong)uVar2 >> 0x20) & 0x1fffffff;
    if (pVVar9->nSize - pGia->nRegs <= (int)uVar16) {
      iVar3 = pGia->vCis->nSize;
      uVar16 = (iVar3 - pVVar9->nSize) + uVar16;
      if (((int)uVar16 < 0) || (iVar3 <= (int)uVar16)) {
LAB_0056dd3b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar16 = pGia->vCis->pArray[uVar16];
      if (((long)(int)uVar16 < 0) || ((uint)pGia->nObjs <= uVar16)) {
LAB_0056dd1c:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pVVar5->nSize <= iVar11) goto LAB_0056dd3b;
      if ((uint)pVVar5->nSize <= uVar16) {
LAB_0056dd79:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      pVVar5->pArray[(int)uVar16] = pVVar5->pArray[lVar15];
      iVar3 = pVVar7->nSize;
    }
  }
  lVar17 = lVar17 + 1;
  if (iVar3 <= lVar17) goto LAB_0056dc17;
  goto LAB_0056db3f;
}

Assistant:

Gia_Man_t * Gia_ManBmcUnroll( Gia_Man_t * pGia, int nFramesMax, int nFramesAdd, int fVerbose, Vec_Int_t ** pvPiMap )
{
    Gia_Obj_t * pObj;
    Gia_Man_t * pNew, * pTemp;
    Vec_Ptr_t * vStates, * vBegins;
    Vec_Int_t * vRoots, * vCone, * vLeaves, * vMap;
    unsigned * pStateF, * pStateP;
    int f, i, iFirst;
    Gia_ManCleanPhase( pGia );
    vCone = Vec_IntAlloc( 1000 );
    vLeaves = Vec_IntAlloc( 1000 );
    // perform ternary simulation
    vStates = Bmc_MnaTernary( pGia, nFramesMax, nFramesAdd, fVerbose, &iFirst );
    // go backward
    *pvPiMap = Vec_IntAlloc( 1000 );
    vBegins = Vec_PtrStart( Vec_PtrSize(vStates) );
    for ( f = Vec_PtrSize(vStates) - 1; f >= 0; f-- )
    {
        // get ternary states
        pStateF = (unsigned *)Vec_PtrEntry(vStates, f);
        pStateP = f ? (unsigned *)Vec_PtrEntry(vStates, f-1) : 0;
        // collect roots of this frame
        vRoots = Vec_IntAlloc( 100 );
        Gia_ManForEachPo( pGia, pObj, i )
            if ( Gia_ManTerSimInfoGet( pStateF, Gia_ObjCioId(pObj) ) == GIA_UND )
                Vec_IntPush( vRoots, Gia_ObjId(pGia, pObj) );
        // add leaves from the previous frame
        Vec_IntAppend( vRoots, vLeaves );
        Vec_PtrWriteEntry( vBegins, f, vRoots );
        // find the cone
        Bmc_MnaCollect( pGia, vRoots, vCone, pStateP ); // computes vCone
        Bmc_MnaSelect( pGia, vRoots, vCone, vLeaves );  // computes vLeaves 
        if ( fVerbose )
        printf( "Frame %4d :  Roots = %6d  Leaves = %6d  Cone = %6d\n", 
            f, Vec_IntSize(vRoots), Vec_IntSize(vLeaves), Vec_IntSize(vCone) );
        if ( Vec_IntSize(vLeaves) == 0 )
            break;
        // it is possible that some of the POs are still ternary... 
    }
    assert( f >= 0 );
    // go forward
    vMap = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    pNew = Gia_ManStart( 10000 );
    pNew->pName = Abc_UtilStrsav( pGia->pName );
    Gia_ManHashStart( pNew );
    for ( f = 0; f < Vec_PtrSize(vStates); f++ )
    {
        vRoots = (Vec_Int_t *)Vec_PtrEntry( vBegins, f );
        if ( vRoots == NULL )
        {
            Gia_ManForEachPo( pGia, pObj, i )
                Gia_ManAppendCo( pNew, 0 );
            continue;
        }
        // get ternary states
        pStateF = (unsigned *)Vec_PtrEntry(vStates, f);
        pStateP = f ? (unsigned *)Vec_PtrEntry(vStates, f-1) : 0;
        // clean POs
        Gia_ManForEachPo( pGia, pObj, i )
            Vec_IntWriteEntry( vMap, Gia_ObjId(pGia, pObj), 0 );
        // find the cone
        Vec_IntPush( *pvPiMap, -f-1 );
        Bmc_MnaCollect( pGia, vRoots, vCone, pStateP );   // computes vCone
        Bmc_MnaBuild( pGia, vRoots, vCone, pNew, vMap, *pvPiMap );  // computes pNew       
        if ( fVerbose )
        printf( "Frame %4d :  Roots = %6d  Leaves = %6d  Cone = %6d\n", 
            f, Vec_IntSize(vRoots), Vec_IntSize(vLeaves), Vec_IntSize(vCone) );
        // create POs
        Gia_ManForEachPo( pGia, pObj, i )
            Gia_ManAppendCo( pNew, Vec_IntEntry(vMap, Gia_ObjId(pGia, pObj)) );
        // set a new map
        Gia_ManForEachObjVec( vRoots, pGia, pObj, i )
            if ( Gia_ObjIsRi(pGia, pObj) )
                Vec_IntWriteEntry( vMap, Gia_ObjId(pGia, Gia_ObjRiToRo(pGia, pObj)), Vec_IntEntry(vMap, Gia_ObjId(pGia, pObj)) );
//            else if ( Gia_ObjIsPo(pGia, pObj) )
//                Gia_ManAppendCo( pNew, Vec_IntEntry(vMap, Gia_ObjId(pGia, pObj)) );
//            else assert( 0 );
    }
    Gia_ManHashStop( pNew );
    Vec_VecFree( (Vec_Vec_t *)vBegins );
    Vec_PtrFreeFree( vStates );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vCone );
    Vec_IntFree( vMap );
    // cleanup
//    Gia_ManPrintStats( pNew, NULL );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
//    Gia_ManPrintStats( pNew, NULL );
    return pNew;
}